

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O2

void __thiscall avro::NodeEnum::printJson(NodeEnum *this,ostream *os,int depth)

{
  ostream *poVar1;
  const_reference pvVar2;
  indent x;
  size_type __n;
  ulong uVar3;
  size_type sVar4;
  
  std::operator<<(os,"{\n");
  x.d = depth + 1;
  operator<<(os,x);
  std::operator<<(os,"\"type\": \"enum\",\n");
  printName(os,&(this->super_NodeImplEnum).nameAttribute_.attr_,x.d);
  operator<<(os,x);
  std::operator<<(os,"\"symbols\": [\n");
  uVar3 = (ulong)((long)(this->super_NodeImplEnum).leafNameAttributes_.attrs_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->super_NodeImplEnum).leafNameAttributes_.attrs_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  __n = 0;
  sVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    sVar4 = __n;
  }
  for (; sVar4 != __n; __n = __n + 1) {
    if (__n != 0) {
      std::operator<<(os,",\n");
    }
    operator<<(os,(indent)(depth + 2));
    poVar1 = std::operator<<(os,'\"');
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&(this->super_NodeImplEnum).leafNameAttributes_.attrs_,__n);
    poVar1 = std::operator<<(poVar1,(string *)pvVar2);
    std::operator<<(poVar1,'\"');
  }
  std::operator<<(os,'\n');
  operator<<(os,x);
  std::operator<<(os,"]\n");
  operator<<(os,(indent)depth);
  std::operator<<(os,'}');
  return;
}

Assistant:

void 
NodeEnum::printJson(std::ostream &os, int depth) const
{
    os << "{\n";
    os << indent(++depth) << "\"type\": \"enum\",\n";
    printName(os, nameAttribute_.get(), depth);
    os << indent(depth) << "\"symbols\": [\n";

    int names = leafNameAttributes_.size();
    ++depth;
    for(int i = 0; i < names; ++i) {
        if(i > 0) {
            os << ",\n";
        }
        os << indent(depth) << '\"' << leafNameAttributes_.get(i) << '\"';
    }
    os << '\n';
    os << indent(--depth) << "]\n";
    os << indent(--depth) << '}';
}